

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextWindow(char *str_id,ImGuiMouseButton mouse_button,bool also_over_items)

{
  bool bVar1;
  undefined1 in_DL;
  ImGuiMouseButton in_ESI;
  ImGuiID id;
  char *unaff_retaddr;
  undefined3 in_stack_00000008;
  ImGuiWindowFlags in_stack_0000001c;
  ImGuiID in_stack_00000020;
  ImGuiID in_stack_00000044;
  undefined3 in_stack_fffffffffffffff0;
  uint flags;
  
  flags = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  ImGuiWindow::GetID((ImGuiWindow *)str_id,(char *)CONCAT44(mouse_button,_in_stack_00000008),
                     unaff_retaddr);
  bVar1 = IsMouseReleased(in_ESI);
  if (((bVar1) && (bVar1 = IsWindowHovered(flags), bVar1)) &&
     (((flags & 0x1000000) != 0 || (bVar1 = IsAnyItemHovered(), !bVar1)))) {
    OpenPopupEx(in_stack_00000044);
  }
  bVar1 = BeginPopupEx(in_stack_00000020,in_stack_0000001c);
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextWindow(const char* str_id, ImGuiMouseButton mouse_button, bool also_over_items)
{
    if (!str_id)
        str_id = "window_context";
    ImGuiID id = GImGui->CurrentWindow->GetID(str_id);
    if (IsMouseReleased(mouse_button) && IsWindowHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        if (also_over_items || !IsAnyItemHovered())
            OpenPopupEx(id);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize|ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoSavedSettings);
}